

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ScriptWitness::Serialize(ByteData *__return_storage_ptr__,ScriptWitness *this)

{
  pointer *this_00;
  bool bVar1;
  size_type v;
  reference this_01;
  iterator __first;
  iterator __last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec8;
  ByteData *this_02;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  const_iterator local_e8;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> work_buffer;
  ByteData *buffer;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  ByteData *stack;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2;
  undefined1 local_48 [8];
  ByteData stack_count;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> buffer_array;
  ScriptWitness *this_local;
  
  this_02 = __return_storage_ptr__;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack_count.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  v = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                (&this->witness_stack_);
  ByteData::GetVariableInt((ByteData *)local_48,v);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &stack_count.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_48);
  __end2 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                     (&this->witness_stack_);
  stack = (ByteData *)
          ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end
                    (&this->witness_stack_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                                *)&stack);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
              ::operator*(&__end2);
    ByteData::Serialize((ByteData *)
                        &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,this_01);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &stack_count.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)0x42ee71);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
    ::operator++(&__end2);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x42eec7);
  this_00 = &stack_count.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_1 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00
                       );
  buffer = (ByteData *)
           ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                        *)&buffer);
    if (!bVar1) break;
    work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                  ::operator*(&__end2_1);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,
                       (ByteData *)
                       work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_f0._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            (in_stack_fffffffffffffec8);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_e8,&local_f0);
    in_stack_fffffffffffffec8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0;
    __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        (in_stack_fffffffffffffec8);
    __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       (in_stack_fffffffffffffec8);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&__range2_1,local_e8,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_02->data_);
    __gnu_cxx::
    __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
    ::operator++(&__end2_1);
  }
  ByteData::ByteData(this_02,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range2_1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_02->data_);
  ByteData::~ByteData((ByteData *)0x42f03d);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_02);
  return __return_storage_ptr__;
}

Assistant:

ByteData ScriptWitness::Serialize() const {
  std::vector<ByteData> buffer_array;
  ByteData stack_count = ByteData::GetVariableInt(witness_stack_.size());
  buffer_array.push_back(stack_count);
  for (const ByteData &stack : witness_stack_) {
    buffer_array.push_back(stack.Serialize());
  }

  std::vector<uint8_t> result;
  for (const ByteData &buffer : buffer_array) {
    std::vector<uint8_t> work_buffer = buffer.GetBytes();
    result.insert(result.end(), work_buffer.begin(), work_buffer.end());
  }
  return ByteData(result);
}